

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O1

void __thiscall Assimp::ObjExporter::WriteMaterialFile(ObjExporter *this)

{
  ostringstream *out;
  char *__s;
  aiMaterial *pMat;
  aiReturn aVar1;
  aiScene *paVar2;
  ostream *poVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  aiColor4D c;
  ai_real o;
  aiString s;
  aiColor4D local_458;
  float local_43c;
  undefined1 local_438 [1032];
  
  out = &this->mOutputMat;
  WriteHeader(this,out);
  paVar2 = this->pScene;
  if (paVar2->mNumMaterials != 0) {
    uVar6 = 0;
    do {
      pMat = paVar2->mMaterials[uVar6];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"newmtl ",7);
      GetMaterialName_abi_cxx11_((string *)local_438,this,(uint)uVar6);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)out,(char *)CONCAT44(local_438._4_4_,local_438._0_4_),
                          local_438._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      if ((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_) != local_438 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_438._4_4_,local_438._0_4_),local_438._16_8_ + 1
                       );
      }
      local_458.r = 0.0;
      local_458.g = 0.0;
      local_458.b = 0.0;
      local_458.a = 0.0;
      aVar1 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,&local_458);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Kd ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.r);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.g);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,&local_458);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Ka ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.r);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.g);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialColor(pMat,"$clr.specular",0,0,&local_458);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Ks ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.r);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.g);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,&local_458);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Ke ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.r);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.g);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialColor(pMat,"$clr.transparent",0,0,&local_458);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Tf ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.r);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.g);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
        poVar3 = std::ostream::_M_insert<double>((double)local_458.b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialFloatArray(pMat,"$mat.opacity",0,0,&local_43c,(uint *)0x0);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"d ",2);
        poVar3 = std::ostream::_M_insert<double>((double)local_43c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialFloatArray(pMat,"$mat.refracti",0,0,&local_43c,(uint *)0x0);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Ni ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_43c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialFloatArray(pMat,"$mat.shininess",0,0,&local_43c,(uint *)0x0);
      iVar5 = 1;
      if ((aVar1 == aiReturn_SUCCESS) && ((local_43c != 0.0 || (NAN(local_43c))))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"Ns ",3);
        poVar3 = std::ostream::_M_insert<double>((double)local_43c);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        iVar5 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"illum ",6);
      poVar3 = (ostream *)std::ostream::operator<<(out,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      local_438._0_4_ = 0;
      local_438._4_4_ = local_438._4_4_ & 0xffffff00;
      memset(local_438 + 5,0x1b,0x3ff);
      aVar1 = aiGetMaterialString(pMat,"$tex.file",1,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_Kd ",7);
        sVar4 = strlen(local_438 + 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_438 + 4,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialString(pMat,"$tex.file",3,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_Ka ",7);
        sVar4 = strlen(local_438 + 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_438 + 4,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialString(pMat,"$tex.file",2,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_Ks ",7);
        sVar4 = strlen(local_438 + 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_438 + 4,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialString(pMat,"$tex.file",7,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_Ns ",7);
        sVar4 = strlen(local_438 + 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_438 + 4,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialString(pMat,"$tex.file",8,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_d ",6);
        sVar4 = strlen(local_438 + 4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,local_438 + 4,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      aVar1 = aiGetMaterialString(pMat,"$tex.file",5,0,(aiString *)local_438);
      if (aVar1 == aiReturn_SUCCESS) {
LAB_00330575:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"bump ",5);
        __s = local_438 + 4;
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,__s,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"map_bump ",9);
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,__s,sVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      }
      else {
        aVar1 = aiGetMaterialString(pMat,"$tex.file",6,0,(aiString *)local_438);
        if (aVar1 == aiReturn_SUCCESS) goto LAB_00330575;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)out,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar6 = uVar6 + 1;
      paVar2 = this->pScene;
    } while (uVar6 < paVar2->mNumMaterials);
  }
  return;
}

Assistant:

void ObjExporter::WriteMaterialFile() {
    WriteHeader(mOutputMat);

    for(unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        const aiMaterial* const mat = pScene->mMaterials[i];

        int illum = 1;
        mOutputMat << "newmtl " << GetMaterialName(i)  << endl;

        aiColor4D c;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_DIFFUSE,c)) {
            mOutputMat << "Kd " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_AMBIENT,c)) {
            mOutputMat << "Ka " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_SPECULAR,c)) {
            mOutputMat << "Ks " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_EMISSIVE,c)) {
            mOutputMat << "Ke " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_TRANSPARENT,c)) {
            mOutputMat << "Tf " << c.r << " " << c.g << " " << c.b << endl;
        }

        ai_real o;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_OPACITY,o)) {
            mOutputMat << "d " << o << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_REFRACTI,o)) {
            mOutputMat << "Ni " << o << endl;
        }

        if(AI_SUCCESS == mat->Get(AI_MATKEY_SHININESS,o) && o) {
            mOutputMat << "Ns " << o << endl;
            illum = 2;
        }

        mOutputMat << "illum " << illum << endl;

        aiString s;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_DIFFUSE(0),s)) {
            mOutputMat << "map_Kd " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_AMBIENT(0),s)) {
            mOutputMat << "map_Ka " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SPECULAR(0),s)) {
            mOutputMat << "map_Ks " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SHININESS(0),s)) {
            mOutputMat << "map_Ns " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_OPACITY(0),s)) {
            mOutputMat << "map_d " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_HEIGHT(0),s) || AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_NORMALS(0),s)) {
            // implementations seem to vary here, so write both variants
            mOutputMat << "bump " << s.data << endl;
            mOutputMat << "map_bump " << s.data << endl;
        }

        mOutputMat << endl;
    }
}